

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehaviorT<long_long,long_long,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,longlong *v,longlong v_min,
               longlong v_max,char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  float *pfVar6;
  longlong lVar7;
  long *in_RCX;
  int in_EDX;
  ImGuiID in_ESI;
  ImVec2 *in_RDI;
  long in_R8;
  long in_R9;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  float in_XMM0_Da;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  double dVar16;
  double dVar17;
  ImVec2 IVar18;
  uint in_stack_00000010;
  ImVec2 *in_stack_00000018;
  float grab_pos;
  float grab_t;
  longlong v_new_off_round;
  longlong v_new_off_floor;
  double v_new_off_f;
  float a_1;
  float a;
  longlong v_new;
  int decimal_precision;
  float delta;
  ImVec2 delta2;
  float mouse_abs_pos;
  float clicked_t;
  bool set_new_value;
  bool value_changed;
  double linear_dist_max_to_0;
  double linear_dist_min_to_0;
  float linear_zero_pos;
  float slider_usable_pos_max;
  float slider_usable_pos_min;
  float slider_usable_sz;
  longlong v_range;
  float grab_sz;
  float slider_sz;
  float grab_padding;
  bool is_power;
  bool is_decimal;
  ImGuiAxis axis;
  ImGuiStyle *style;
  ImGuiContext *g;
  double in_stack_fffffffffffffec8;
  float in_stack_fffffffffffffed0;
  float in_stack_fffffffffffffed4;
  float in_stack_fffffffffffffed8;
  float in_stack_fffffffffffffedc;
  ImRect *in_stack_fffffffffffffee0;
  long local_110;
  bool local_101;
  float in_stack_ffffffffffffff00;
  float in_stack_ffffffffffffff04;
  float in_stack_ffffffffffffff08;
  float in_stack_ffffffffffffff0c;
  float in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  ImVec2 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  ImGuiDataType in_stack_ffffffffffffff24;
  ImVec2 in_stack_ffffffffffffff28;
  float in_stack_ffffffffffffff30;
  float fStack_cc;
  float local_98;
  float local_94;
  float fStack_90;
  float local_88;
  bool local_81;
  float local_70;
  float local_54;
  
  pIVar4 = GImGui;
  bVar8 = (in_stack_00000010 & 1) != 0;
  bVar9 = in_EDX == 8;
  bVar10 = in_EDX == 9;
  local_101 = bVar9 || bVar10;
  if ((in_XMM0_Da == 1.0) && (!NAN(in_XMM0_Da))) {
    local_101 = false;
  }
  fVar11 = ImVec2::operator[]((ImVec2 *)
                              CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                              (size_t)in_stack_fffffffffffffec8);
  fVar12 = ImVec2::operator[]((ImVec2 *)
                              CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                              (size_t)in_stack_fffffffffffffec8);
  fVar11 = (fVar11 - fVar12) - 4.0;
  local_54 = (pIVar4->Style).GrabMinSize;
  if (in_R8 < in_R9) {
    local_110 = in_R9 - in_R8;
  }
  else {
    local_110 = in_R8 - in_R9;
  }
  local_94 = in_stack_fffffffffffffed8;
  if ((!bVar9 && !bVar10) && (-1 < local_110)) {
    local_54 = ImMax<float>(fVar11 / (float)(local_110 + 1),(pIVar4->Style).GrabMinSize);
    local_94 = in_stack_fffffffffffffed8;
  }
  fVar12 = ImMin<float>(local_54,fVar11);
  fVar13 = ImVec2::operator[]((ImVec2 *)
                              CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                              (size_t)in_stack_fffffffffffffec8);
  fVar13 = fVar12 * 0.5 + fVar13 + 2.0;
  fVar14 = ImVec2::operator[]((ImVec2 *)
                              CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                              (size_t)in_stack_fffffffffffffec8);
  if ((!local_101) || (0.0 <= (float)(in_R8 * in_R9))) {
    local_70 = (float)(-(uint)((float)in_R8 < 0.0) & 0x3f800000);
  }
  else {
    dVar16 = ImPow((double)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   in_stack_fffffffffffffec8);
    if (in_R9 < 0) {
      in_stack_fffffffffffffee0 = (ImRect *)-(double)in_R9;
    }
    else {
      in_stack_fffffffffffffee0 = (ImRect *)(double)in_R9;
    }
    dVar17 = ImPow((double)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   in_stack_fffffffffffffec8);
    local_70 = (float)(dVar16 / (dVar16 + dVar17));
  }
  local_81 = false;
  if (pIVar4->ActiveId == in_ESI) {
    bVar5 = false;
    local_88 = 0.0;
    if (pIVar4->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (((pIVar4->IO).MouseDown[0] & 1U) == 0) {
        ClearActiveID();
      }
      else {
        pfVar6 = ImVec2::operator[]((ImVec2 *)
                                    CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                    (size_t)in_stack_fffffffffffffec8);
        if (fVar11 - fVar12 <= 0.0) {
          in_stack_fffffffffffffedc = 0.0;
        }
        else {
          in_stack_fffffffffffffedc = ImClamp<float>((*pfVar6 - fVar13) / (fVar11 - fVar12),0.0,1.0)
          ;
        }
        local_88 = in_stack_fffffffffffffedc;
        if (bVar8) {
          local_88 = 1.0 - in_stack_fffffffffffffedc;
        }
        bVar5 = true;
      }
    }
    else if (pIVar4->ActiveIdSource == ImGuiInputSource_Nav) {
      IVar18 = GetNavInputAmount2d((ImGuiNavDirSourceFlags)in_stack_ffffffffffffff0c,
                                   (ImGuiInputReadMode)in_stack_ffffffffffffff08,
                                   in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
      if (bVar8) {
        fStack_90 = IVar18.y;
        local_94 = -fStack_90;
      }
      else {
        local_94 = IVar18.x;
      }
      if ((pIVar4->NavActivatePressedId == in_ESI) && ((pIVar4->ActiveIdIsJustActivated & 1U) == 0))
      {
        ClearActiveID();
      }
      else if ((local_94 != 0.0) || (NAN(local_94))) {
        fVar15 = local_94;
        local_88 = SliderCalcRatioFromValueT<long_long,double>
                             ((ImGuiDataType)in_stack_ffffffffffffff30,
                              (longlong)in_stack_ffffffffffffff28,
                              CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                              (longlong)in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,
                              in_stack_ffffffffffffff10);
        if (bVar9 || bVar10) {
          in_stack_fffffffffffffed4 =
               (float)ImParseFormatPrecision
                                ((char *)CONCAT44(in_stack_fffffffffffffedc,fVar15),
                                 (int)in_stack_fffffffffffffed4);
        }
        else {
          in_stack_fffffffffffffed4 = 0.0;
        }
        if ((0 < (int)in_stack_fffffffffffffed4) || (local_101)) {
          local_98 = local_94 / 100.0;
          bVar5 = IsNavInputDown(0xe);
          if (bVar5) {
            local_98 = local_98 / 10.0;
          }
        }
        else if (((-100.0 <= (float)local_110) && ((float)local_110 <= 100.0)) ||
                (bVar5 = IsNavInputDown(0xe), bVar5)) {
          local_98 = (float)(~-(uint)(local_94 < 0.0) & 0x3f800000 |
                            -(uint)(local_94 < 0.0) & 0xbf800000) / (float)local_110;
        }
        else {
          local_98 = local_94 / 100.0;
        }
        bVar5 = IsNavInputDown(0xf);
        if (bVar5) {
          local_98 = local_98 * 10.0;
        }
        bVar5 = true;
        if (((1.0 <= local_88) && (0.0 < local_98)) || ((local_88 <= 0.0 && (local_98 < 0.0)))) {
          bVar5 = false;
          local_94 = fVar15;
        }
        else {
          local_88 = ImSaturate(local_88 + local_98);
          local_94 = fVar15;
        }
      }
    }
    if (bVar5) {
      if (local_101) {
        if (local_70 <= local_88) {
          fVar15 = ImPow(0.0,4.241024e-39);
          lVar7 = ImMax<long_long>(in_R8,0);
          ImLerp<long_long>(lVar7,in_R9,fVar15);
        }
        else {
          fVar15 = ImPow(0.0,4.240744e-39);
          lVar7 = ImMin<long_long>(in_R9,0);
          ImLerp<long_long>(lVar7,in_R8,fVar15);
        }
      }
      else if (bVar9 || bVar10) {
        ImLerp<long_long>(in_R8,in_R9,local_88);
      }
      lVar7 = RoundScalarWithFormatT<long_long,long_long>
                        ((char *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                         (longlong)in_stack_ffffffffffffff18);
      local_81 = *in_RCX != lVar7;
      if (local_81) {
        *in_RCX = lVar7;
      }
    }
  }
  if (1.0 <= fVar11) {
    fVar11 = SliderCalcRatioFromValueT<long_long,double>
                       ((ImGuiDataType)in_stack_ffffffffffffff30,(longlong)in_stack_ffffffffffffff28
                        ,CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        (longlong)in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,
                        in_stack_ffffffffffffff10);
    if (bVar8) {
      fVar11 = 1.0 - fVar11;
    }
    ImLerp<float>(fVar13,-fVar12 * 0.5 + (fVar14 - 2.0),fVar11);
    if (bVar8) {
      ImRect::ImRect(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,local_94,
                     in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
      IVar18.y = in_stack_ffffffffffffff04;
      IVar18.x = in_stack_ffffffffffffff00;
      *in_stack_00000018 = IVar18;
      IVar1.y = in_stack_ffffffffffffff0c;
      IVar1.x = in_stack_ffffffffffffff08;
      in_stack_00000018[1] = IVar1;
    }
    else {
      ImRect::ImRect(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,local_94,
                     in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
      IVar2.y = in_stack_ffffffffffffff14;
      IVar2.x = in_stack_ffffffffffffff10;
      *in_stack_00000018 = IVar2;
      in_stack_00000018[1] = in_stack_ffffffffffffff18;
    }
  }
  else {
    ImRect::ImRect((ImRect *)&stack0xffffffffffffff28,in_RDI,in_RDI);
    *in_stack_00000018 = in_stack_ffffffffffffff28;
    IVar3.y = fStack_cc;
    IVar3.x = in_stack_ffffffffffffff30;
    in_stack_00000018[1] = IVar3;
  }
  return local_81;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f / power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f / power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = (axis == ImGuiAxis_X) ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderCalcRatioFromValueT<TYPE, FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if ((decimal_precision > 0) || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = SliderCalcRatioFromValueT<TYPE, FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}